

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O3

ssize_t __thiscall
duckdb_parquet::TimeType::read(TimeType *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ssize_t sVar5;
  _func_int **pp_Var6;
  undefined8 *puVar7;
  short *__nbytes_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  TProtocol *this_00;
  int16_t fid;
  TType ftype;
  string fname;
  short local_6e;
  undefined4 local_6c;
  undefined4 local_68;
  int local_64;
  TimeUnit *local_60;
  bool *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  this_00 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  duckdb_apache::thrift::protocol::TProtocol::incrementInputRecursionDepth(this_00);
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  iVar1 = (*this_00->_vptr_TProtocol[0x19])(this_00,&local_50);
  local_60 = &this->unit;
  local_58 = &this->isAdjustedToUTC;
  local_68 = 0;
  local_6c = 0;
  do {
    __nbytes_00 = &local_6e;
    iVar2 = (*this_00->_vptr_TProtocol[0x1b])(this_00,&local_50,&local_64);
    if (local_64 == 0) {
      iVar3 = (*this_00->_vptr_TProtocol[0x1a])(this_00);
      if (((byte)local_68 & (byte)local_6c & 1) != 0) {
        if (local_50 != local_40) {
          operator_delete(local_50);
        }
        this_00->input_recursion_depth_ = this_00->input_recursion_depth_ - 1;
        return (ulong)(uint)(iVar3 + iVar2 + iVar1);
      }
      puVar7 = (undefined8 *)__cxa_allocate_exception(0x30);
      puVar7[1] = puVar7 + 3;
      puVar7[2] = 0;
      *(undefined1 *)(puVar7 + 3) = 0;
      *puVar7 = &PTR__TException_019aa480;
      *(undefined4 *)(puVar7 + 5) = 1;
      __cxa_throw(puVar7,&duckdb_apache::thrift::protocol::TProtocolException::typeinfo,
                  duckdb_apache::thrift::TException::~TException);
    }
    if (local_6e == 2) {
      if (local_64 != 0xc) goto LAB_0109f61a;
      sVar5 = TimeUnit::read(local_60,__fd,__buf_00,(size_t)__nbytes_00);
      iVar3 = (int)sVar5;
      local_6c = (undefined4)CONCAT71((int7)((ulong)sVar5 >> 8),1);
    }
    else {
      if (local_6e == 1) {
        pp_Var6 = this_00->_vptr_TProtocol;
        if (local_64 == 2) {
          iVar3 = (*pp_Var6[0x23])(this_00,local_58);
          local_68 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
          goto LAB_0109f629;
        }
      }
      else {
LAB_0109f61a:
        pp_Var6 = this_00->_vptr_TProtocol;
      }
      iVar3 = (*pp_Var6[0x2c])(this_00);
    }
LAB_0109f629:
    iVar4 = (*this_00->_vptr_TProtocol[0x1c])(this_00);
    iVar1 = iVar3 + iVar2 + iVar1 + iVar4;
  } while( true );
}

Assistant:

uint32_t TimeType::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;

  bool isset_isAdjustedToUTC = false;
  bool isset_unit = false;

  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_BOOL) {
          xfer += iprot->readBool(this->isAdjustedToUTC);
          isset_isAdjustedToUTC = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 2:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->unit.read(iprot);
          isset_unit = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  if (!isset_isAdjustedToUTC)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_unit)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  return xfer;
}